

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

bool LTACMasterdataChannel::RequestMasterData(FDKeyTy *keyAc,string *callSign,double distance)

{
  bool bVar1;
  acStatUpdateTy *in_RDI;
  double in_XMM0_Qa;
  acStatUpdateTy acUpd;
  unsigned_long dist;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  FDKeyTy *in_stack_ffffffffffffff58;
  acStatUpdateTy *in_stack_ffffffffffffff60;
  acStatUpdateTy *in_stack_ffffffffffffffa0;
  LTACMasterdataChannel *in_stack_ffffffffffffffa8;
  bool local_1;
  
  bVar1 = LTFlightData::FDKeyTy::empty((FDKeyTy *)0x1c571d);
  if ((bVar1) || ((in_RDI->acKey).eKeyType != KEY_ICAO)) {
    local_1 = false;
  }
  else {
    std::isnan(in_XMM0_Qa);
    str_toupper_c(in_stack_ffffffffffffff48);
    acStatUpdateTy::acStatUpdateTy
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               (unsigned_long)in_stack_ffffffffffffff48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    local_1 = PassOnRequest(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    acStatUpdateTy::~acStatUpdateTy(in_RDI);
  }
  return local_1;
}

Assistant:

bool LTACMasterdataChannel::RequestMasterData (const LTFlightData::FDKeyTy& keyAc,
                                               const std::string& callSign,
                                               double distance)
{
    // Sanity check
    if (keyAc.empty() || keyAc.eKeyType != LTFlightData::KEY_ICAO) return false;
    
    // Prepare the request object that is to be added later
    const unsigned long dist = std::isnan(distance) ? UINT_MAX : (unsigned long) (distance);
    const acStatUpdateTy acUpd (keyAc,str_toupper_c(callSign),dist);

    // Pass the request to the first channel of our list
    return PassOnRequest(nullptr, acUpd);
}